

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

tmbstr get_escaped_name(ctmbstr name)

{
  byte bVar1;
  byte *pbVar2;
  char *__s;
  size_t sVar3;
  int iVar4;
  int iVar5;
  char aux [2];
  byte local_1a [2];
  
  iVar5 = 0;
  pbVar2 = (byte *)name;
LAB_00132541:
  bVar1 = *pbVar2;
  if (bVar1 < 0x3c) {
    if (bVar1 != 0x22) {
      if (bVar1 != 0) goto LAB_0013256a;
      __s = (char *)malloc((ulong)(iVar5 + 1));
      if (__s == (char *)0x0) {
        outOfMemory();
      }
      *__s = '\0';
      local_1a[1] = 0;
      do {
        bVar1 = *name;
        if (bVar1 < 0x3c) {
          if (bVar1 == 0x22) {
            sVar3 = strlen(__s);
            builtin_strncpy(__s + sVar3,"&quot;",7);
          }
          else {
            if (bVar1 == 0) {
              return __s;
            }
LAB_001325f9:
            local_1a[0] = bVar1;
            strcat(__s,(char *)local_1a);
          }
        }
        else {
          if (bVar1 == 0x3e) {
            sVar3 = strlen(__s);
            builtin_strncpy(__s + sVar3,"&gt;",4);
          }
          else {
            if (bVar1 != 0x3c) goto LAB_001325f9;
            sVar3 = strlen(__s);
            builtin_strncpy(__s + sVar3,"&lt;",4);
          }
          __s[sVar3 + 4] = '\0';
        }
        name = (ctmbstr)((byte *)name + 1);
      } while( true );
    }
    iVar4 = 6;
  }
  else {
    iVar4 = 4;
    if ((bVar1 != 0x3c) && (bVar1 != 0x3e)) {
LAB_0013256a:
      iVar4 = 1;
    }
  }
  iVar5 = iVar5 + iVar4;
  pbVar2 = pbVar2 + 1;
  goto LAB_00132541;
}

Assistant:

static tmbstr get_escaped_name( ctmbstr name )
{
    tmbstr escpName;
    char aux[2];
    uint len = 0;
    ctmbstr c;
    for(c=name; *c!='\0'; ++c)
        switch(*c)
    {
        case '<':
        case '>':
            len += 4;
            break;
        case '"':
            len += 6;
            break;
        default:
            len += 1;
            break;
    }

    escpName = (tmbstr)malloc(len+1);
    if (!escpName) outOfMemory();
    escpName[0] = '\0';

    aux[1] = '\0';
    for(c=name; *c!='\0'; ++c)
        switch(*c)
    {
        case '<':
            strcat(escpName, "&lt;");
            break;
        case '>':
            strcat(escpName, "&gt;");
            break;
        case '"':
            strcat(escpName, "&quot;");
            break;
        default:
            aux[0] = *c;
            strcat(escpName, aux);
            break;
    }

    return escpName;
}